

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubwordEncoder.cc
# Opt level: O0

vector<onmt::Token,_std::allocator<onmt::Token>_> * __thiscall
onmt::SubwordEncoder::encode_and_annotate
          (SubwordEncoder *this,vector<onmt::Token,_std::allocator<onmt::Token>_> *tokens,
          bool training)

{
  bool bVar1;
  undefined1 uVar2;
  iterator __position;
  move_iterator<__gnu_cxx::__normal_iterator<onmt::Token_*,_std::vector<onmt::Token,_std::allocator<onmt::Token>_>_>_>
  __last;
  byte in_CL;
  vector<onmt::Token,_std::allocator<onmt::Token>_> *in_RDX;
  long *in_RSI;
  vector<onmt::Token,_std::allocator<onmt::Token>_> *in_RDI;
  vector<onmt::Token,_std::allocator<onmt::Token>_> sub_segments;
  Token *token;
  const_iterator __end1;
  const_iterator __begin1;
  vector<onmt::Token,_std::allocator<onmt::Token>_> *__range1;
  vector<onmt::Token,_std::allocator<onmt::Token>_> *segments;
  iterator in_stack_ffffffffffffff28;
  move_iterator<__gnu_cxx::__normal_iterator<onmt::Token_*,_std::vector<onmt::Token,_std::allocator<onmt::Token>_>_>_>
  in_stack_ffffffffffffff30;
  move_iterator<__gnu_cxx::__normal_iterator<onmt::Token_*,_std::vector<onmt::Token,_std::allocator<onmt::Token>_>_>_>
  in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  vector<onmt::Token,_std::allocator<onmt::Token>_> *__n;
  vector<onmt::Token,_std::allocator<onmt::Token>_> *in_stack_ffffffffffffff60;
  move_iterator<__gnu_cxx::__normal_iterator<onmt::Token_*,_std::vector<onmt::Token,_std::allocator<onmt::Token>_>_>_>
  __first;
  undefined1 local_68 [24];
  reference local_50;
  Token *local_48;
  __normal_iterator<const_onmt::Token_*,_std::vector<onmt::Token,_std::allocator<onmt::Token>_>_>
  local_40;
  vector<onmt::Token,_std::allocator<onmt::Token>_> *local_38;
  undefined1 local_1a;
  byte local_19;
  vector<onmt::Token,_std::allocator<onmt::Token>_> *local_18;
  
  local_19 = in_CL & 1;
  local_1a = 0;
  __n = in_RDI;
  local_18 = in_RDX;
  std::vector<onmt::Token,_std::allocator<onmt::Token>_>::vector
            ((vector<onmt::Token,_std::allocator<onmt::Token>_> *)0x3be571);
  std::vector<onmt::Token,_std::allocator<onmt::Token>_>::size(local_18);
  std::vector<onmt::Token,_std::allocator<onmt::Token>_>::reserve
            (in_stack_ffffffffffffff60,(size_type)__n);
  local_38 = local_18;
  local_40._M_current =
       (Token *)std::vector<onmt::Token,_std::allocator<onmt::Token>_>::begin
                          (in_stack_ffffffffffffff28._M_current);
  local_48 = (Token *)std::vector<onmt::Token,_std::allocator<onmt::Token>_>::end
                                (in_stack_ffffffffffffff28._M_current);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_onmt::Token_*,_std::vector<onmt::Token,_std::allocator<onmt::Token>_>_>
                             *)in_stack_ffffffffffffff30._M_current._M_current,
                            (__normal_iterator<const_onmt::Token_*,_std::vector<onmt::Token,_std::allocator<onmt::Token>_>_>
                             *)in_stack_ffffffffffffff28._M_current), bVar1) {
    local_50 = __gnu_cxx::
               __normal_iterator<const_onmt::Token_*,_std::vector<onmt::Token,_std::allocator<onmt::Token>_>_>
               ::operator*(&local_40);
    uVar2 = Token::is_placeholder((Token *)0x3be60a);
    if ((bool)uVar2) {
      std::vector<onmt::Token,_std::allocator<onmt::Token>_>::push_back
                ((vector<onmt::Token,_std::allocator<onmt::Token>_> *)
                 CONCAT17(uVar2,in_stack_ffffffffffffff40),
                 (value_type *)in_stack_ffffffffffffff38._M_current._M_current);
    }
    else {
      (**(code **)(*in_RSI + 0x38))(local_68,in_RSI,local_50,local_19 & 1);
      __position = std::vector<onmt::Token,_std::allocator<onmt::Token>_>::end
                             (in_stack_ffffffffffffff28._M_current);
      __gnu_cxx::
      __normal_iterator<onmt::Token_const*,std::vector<onmt::Token,std::allocator<onmt::Token>>>::
      __normal_iterator<onmt::Token*>
                ((__normal_iterator<const_onmt::Token_*,_std::vector<onmt::Token,_std::allocator<onmt::Token>_>_>
                  *)in_stack_ffffffffffffff30._M_current._M_current,
                 (__normal_iterator<onmt::Token_*,_std::vector<onmt::Token,_std::allocator<onmt::Token>_>_>
                  *)in_stack_ffffffffffffff28._M_current);
      __last._M_current._M_current =
           std::vector<onmt::Token,_std::allocator<onmt::Token>_>::begin
                     ((vector<onmt::Token,_std::allocator<onmt::Token>_> *)
                      in_stack_ffffffffffffff28._M_current);
      in_stack_ffffffffffffff38 =
           std::
           make_move_iterator<__gnu_cxx::__normal_iterator<onmt::Token*,std::vector<onmt::Token,std::allocator<onmt::Token>>>>
                     ((__normal_iterator<onmt::Token_*,_std::vector<onmt::Token,_std::allocator<onmt::Token>_>_>
                       )in_stack_ffffffffffffff28._M_current);
      __first = in_stack_ffffffffffffff38;
      std::vector<onmt::Token,_std::allocator<onmt::Token>_>::end
                ((vector<onmt::Token,_std::allocator<onmt::Token>_> *)
                 in_stack_ffffffffffffff28._M_current);
      in_stack_ffffffffffffff30 =
           std::
           make_move_iterator<__gnu_cxx::__normal_iterator<onmt::Token*,std::vector<onmt::Token,std::allocator<onmt::Token>>>>
                     ((__normal_iterator<onmt::Token_*,_std::vector<onmt::Token,_std::allocator<onmt::Token>_>_>
                       )in_stack_ffffffffffffff28._M_current);
      in_stack_ffffffffffffff28 =
           std::vector<onmt::Token,std::allocator<onmt::Token>>::
           insert<std::move_iterator<__gnu_cxx::__normal_iterator<onmt::Token*,std::vector<onmt::Token,std::allocator<onmt::Token>>>>,void>
                     ((vector<onmt::Token,_std::allocator<onmt::Token>_> *)
                      in_stack_ffffffffffffff30._M_current._M_current,__position._M_current,__first,
                      __last);
      std::vector<onmt::Token,_std::allocator<onmt::Token>_>::~vector
                ((vector<onmt::Token,_std::allocator<onmt::Token>_> *)
                 CONCAT17(uVar2,in_stack_ffffffffffffff40));
    }
    __gnu_cxx::
    __normal_iterator<const_onmt::Token_*,_std::vector<onmt::Token,_std::allocator<onmt::Token>_>_>
    ::operator++(&local_40);
  }
  return in_RDI;
}

Assistant:

std::vector<Token> SubwordEncoder::encode_and_annotate(const std::vector<Token>& tokens,
                                                         bool training) const
  {
    std::vector<Token> segments;
    segments.reserve(tokens.size() * 2);

    for (const auto& token : tokens)
    {
      if (token.is_placeholder()) {
        segments.push_back(token);
        continue;
      }

      std::vector<Token> sub_segments = encode_and_annotate(token, training);
      segments.insert(segments.end(),
                      std::make_move_iterator(sub_segments.begin()),
                      std::make_move_iterator(sub_segments.end()));
    }

    return segments;
  }